

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall tinyxml2::XMLElement::Attribute(XMLElement *this,char *name,char *value)

{
  bool bVar1;
  XMLAttribute *this_00;
  char *p;
  XMLAttribute *a;
  char *value_local;
  char *name_local;
  XMLElement *this_local;
  
  this_00 = FindAttribute(this,name);
  if (this_00 == (XMLAttribute *)0x0) {
    this_local = (XMLElement *)0x0;
  }
  else {
    if (value != (char *)0x0) {
      p = XMLAttribute::Value(this_00);
      bVar1 = XMLUtil::StringEqual(p,value,0x7fffffff);
      if (!bVar1) {
        return (char *)0x0;
      }
    }
    this_local = (XMLElement *)XMLAttribute::Value(this_00);
  }
  return (char *)this_local;
}

Assistant:

const char* XMLElement::Attribute( const char* name, const char* value ) const
{
    const XMLAttribute* a = FindAttribute( name );
    if ( !a ) {
        return 0;
    }
    if ( !value || XMLUtil::StringEqual( a->Value(), value )) {
        return a->Value();
    }
    return 0;
}